

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy-mpi.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  BigAttr *pBVar2;
  char *pcVar3;
  char **ppcVar4;
  FILE *__stream;
  char *__format;
  ulong uVar5;
  ulong local_48;
  size_t nattr;
  char **ppcStack_38;
  int argc_local;
  char **argv_local;
  
  nattr._4_4_ = argc;
  ppcStack_38 = argv;
  MPI_Init((long)&nattr + 4,&stack0xffffffffffffffc8);
  MPI_Comm_rank(&ompi_mpi_comm_world,&ThisTask);
  MPI_Comm_size(&ompi_mpi_comm_world,&NTask);
  MPI_Type_contiguous(2,&ompi_mpi_long,&MPI_TYPE_WORK);
  MPI_Type_commit(&MPI_TYPE_WORK);
  while (iVar1 = getopt(nattr._4_4_,ppcStack_38,"n:N:vb:f:"), iVar1 != -1) {
    switch((iVar1 - 0x4eU) * 0x40000000 | iVar1 - 0x4eU >> 2) {
    case 0:
    case 8:
      Nfile = atoi(_optarg);
      break;
    default:
      goto switchD_00103620_caseD_1;
    case 5:
      __isoc99_sscanf(_optarg,"%td",&buffersize);
      break;
    case 6:
      newfilepath = _optarg;
      break;
    case 10:
      verbose = 1;
    }
  }
  if (nattr._4_4_ - _optind == 3) {
    ppcVar4 = ppcStack_38 + _optind;
    ppcStack_38 = ppcVar4 + -1;
    iVar1 = big_file_mpi_open(&bf,*ppcVar4,(MPI_Comm)&ompi_mpi_comm_world);
    if ((iVar1 == 0) &&
       (iVar1 = big_file_mpi_open_block(&bf,&bb,ppcStack_38[2],(MPI_Comm)&ompi_mpi_comm_world),
       iVar1 == 0)) {
      if (bb.Nfile == 0 || Nfile == -1) {
        Nfile = bb.Nfile;
      }
      if (newfilepath == (char *)0x0) {
        newfilepath = ppcStack_38[1];
      }
      iVar1 = big_file_mpi_create(&bfnew,newfilepath,(MPI_Comm)&ompi_mpi_comm_world);
      if (iVar1 == 0) {
        iVar1 = big_file_mpi_create_block
                          (&bfnew,&bbnew,ppcStack_38[3],bb.dtype,bb.nmemb,Nfile,bb.size,
                           (MPI_Comm)&ompi_mpi_comm_world);
        __stream = _stderr;
        if (iVar1 == 0) {
          if (bbnew.size != bb.size) {
            abort();
          }
          pBVar2 = big_block_list_attrs(&bb,&local_48);
          ppcVar4 = &pBVar2->data;
          for (uVar5 = 0; uVar5 < local_48; uVar5 = uVar5 + 1) {
            big_block_set_attr(&bbnew,ppcVar4[-1],*ppcVar4,(char *)((long)ppcVar4 + -0x14),
                               ((BigAttr *)(ppcVar4 + -3))->nmemb);
            ppcVar4 = ppcVar4 + 4;
          }
          if ((0 < bb.nmemb) && (bb.size != 0)) {
            if (ThisTask == 0) {
              server();
            }
            else {
              slave();
            }
          }
          iVar1 = big_block_mpi_close(&bbnew,(MPI_Comm)&ompi_mpi_comm_world);
          __stream = _stderr;
          if (iVar1 == 0) {
            big_block_mpi_close(&bb,(MPI_Comm)&ompi_mpi_comm_world);
            big_file_mpi_close(&bf,(MPI_Comm)&ompi_mpi_comm_world);
            big_file_mpi_close(&bfnew,(MPI_Comm)&ompi_mpi_comm_world);
            return 0;
          }
          pcVar3 = big_file_get_error_message();
          __format = "failed to close new: %s\n";
        }
        else {
          pcVar3 = big_file_get_error_message();
          __format = "failed to create temp: %s\n";
        }
        goto LAB_0010389b;
      }
    }
  }
  else {
switchD_00103620_caseD_1:
    usage();
  }
  __stream = _stderr;
  pcVar3 = big_file_get_error_message();
  __format = "failed to open: %s\n";
LAB_0010389b:
  fprintf(__stream,__format,pcVar3);
  exit(1);
}

Assistant:

int main(int argc, char * argv[]) {

    MPI_Init(&argc, &argv);

    MPI_Comm_rank(MPI_COMM_WORLD, &ThisTask);
    MPI_Comm_size(MPI_COMM_WORLD, &NTask);

    MPI_Type_contiguous(2, MPI_LONG, &MPI_TYPE_WORK);
    MPI_Type_commit(&MPI_TYPE_WORK);

    int ch;
    while(-1 != (ch = getopt(argc, argv, "n:N:vb:f:"))) {
        switch(ch) {
            case 'N':
            case 'n':
                Nfile = atoi(optarg);
                break;
            case 'b':
                sscanf(optarg, "%td", &buffersize);
                break;
            case 'f':
                newfilepath = optarg;
                break;
            case 'v':
                verbose = 1;
                break;
            default:
                usage();
        }
    }
    if(argc - optind + 1 != 4) {
        usage();
    }
    argv += optind - 1;
    if(0 != big_file_mpi_open(&bf, argv[1], MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_mpi_open_block(&bf, &bb, argv[2], MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(Nfile == -1 || bb.Nfile == 0) {
        Nfile = bb.Nfile;
    }
    if(newfilepath == NULL) {
        newfilepath = argv[1];
    }
    if(0 != big_file_mpi_create(&bfnew, newfilepath, MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_mpi_create_block(&bfnew, &bbnew, argv[3], bb.dtype, bb.nmemb, Nfile, bb.size, MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to create temp: %s\n", big_file_get_error_message());
        exit(1);
    }

    if(bbnew.size != bb.size) {
        abort();
    }

    /* copy attrs */
    size_t nattr;
    BigAttr * attrs = big_block_list_attrs(&bb, &nattr);
    int i;
    for(i = 0; i < nattr; i ++) {
        BigAttr * attr = &attrs[i];
        big_block_set_attr(&bbnew, attr->name, attr->data, attr->dtype, attr->nmemb);
    }

    if(bb.nmemb > 0 && bb.size > 0) {
    /* copy data */
        if(ThisTask == 0) {
            server();
        } else {
            slave();
        }
    }
    if(0 != big_block_mpi_close(&bbnew, MPI_COMM_WORLD)) {
        fprintf(stderr, "failed to close new: %s\n", big_file_get_error_message());
        exit(1);
    }
    big_block_mpi_close(&bb, MPI_COMM_WORLD);
    big_file_mpi_close(&bf, MPI_COMM_WORLD);
    big_file_mpi_close(&bfnew, MPI_COMM_WORLD);
    return 0;
}